

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O0

void __thiscall
TEST_TestRegistry_listTestLocations_shouldListBackwardsGroupATestaAfterGroupAtestaa_Test::testBody
          (TEST_TestRegistry_listTestLocations_shouldListBackwardsGroupATestaAfterGroupAtestaa_Test
           *this)

{
  TestRegistry *pTVar1;
  SimpleString *other;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  undefined1 local_20 [8];
  SimpleString s;
  TEST_TestRegistry_listTestLocations_shouldListBackwardsGroupATestaAfterGroupAtestaa_Test
  *this_local;
  
  s.bufferSize_ = (size_t)this;
  UtestShell::setGroupName
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1)->super_UtestShell,"GROUP_A"
            );
  UtestShell::setTestName
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1)->super_UtestShell,"test_a")
  ;
  UtestShell::setFileName
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1)->super_UtestShell,
             "cpptest_simple/my_tests/testa.cpp");
  UtestShell::setLineNumber
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1)->super_UtestShell,100);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1);
  UtestShell::setGroupName
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2)->super_UtestShell,"GROUP_B"
            );
  UtestShell::setTestName
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2)->super_UtestShell,"test_b")
  ;
  UtestShell::setFileName
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2)->super_UtestShell,
             "cpptest_simple/my tests/testb.cpp");
  UtestShell::setLineNumber
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2)->super_UtestShell,200);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2);
  UtestShell::setGroupName
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test3)->super_UtestShell,"GROUP_A"
            );
  UtestShell::setTestName
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test3)->super_UtestShell,"test_aa"
            );
  UtestShell::setFileName
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test3)->super_UtestShell,
             "cpptest_simple/my_tests/testaa.cpp");
  UtestShell::setLineNumber
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test3)->super_UtestShell,300);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).test3);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[10])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).result);
  other = StringBufferTestOutput::getOutput
                    ((this->super_TEST_GROUP_CppUTestGroupTestRegistry).output);
  SimpleString::SimpleString((SimpleString *)local_20,other);
  pUVar2 = UtestShell::getCurrent();
  pcVar3 = SimpleString::asCharString((SimpleString *)local_20);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,
             "GROUP_A.test_aa.cpptest_simple/my_tests/testaa.cpp.300\nGROUP_B.test_b.cpptest_simple/my tests/testb.cpp.200\nGROUP_A.test_a.cpptest_simple/my_tests/testa.cpp.100\n"
             ,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x180,pTVar4);
  SimpleString::~SimpleString((SimpleString *)local_20);
  return;
}

Assistant:

TEST(TestRegistry, listTestLocations_shouldListBackwardsGroupATestaAfterGroupAtestaa)
{
    test1->setGroupName("GROUP_A");
    test1->setTestName("test_a");
    test1->setFileName("cpptest_simple/my_tests/testa.cpp");
    test1->setLineNumber(100);
    myRegistry->addTest(test1);
    test2->setGroupName("GROUP_B");
    test2->setTestName("test_b");
    test2->setFileName("cpptest_simple/my tests/testb.cpp");
    test2->setLineNumber(200);
    myRegistry->addTest(test2);
    test3->setGroupName("GROUP_A");
    test3->setTestName("test_aa");
    test3->setFileName("cpptest_simple/my_tests/testaa.cpp");
    test3->setLineNumber(300);
    myRegistry->addTest(test3);

    myRegistry->listTestLocations(*result);
    SimpleString s = output->getOutput();
    STRCMP_EQUAL("GROUP_A.test_aa.cpptest_simple/my_tests/testaa.cpp.300\nGROUP_B.test_b.cpptest_simple/my tests/testb.cpp.200\nGROUP_A.test_a.cpptest_simple/my_tests/testa.cpp.100\n", s.asCharString());
}